

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequencer.cpp
# Opt level: O2

void __thiscall egc::Sequencer::SU(Sequencer *this,unsigned_short instruction)

{
  unsigned_short word;
  unsigned_short a;
  pair<unsigned_short,_unsigned_short> pVar1;
  ostream *poVar2;
  ushort address;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"SU");
  poVar2 = std::operator<<(poVar2," ");
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 0x40;
  address = instruction & 0xfff;
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,address);
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
  std::endl<char,std::char_traits<char>>(poVar2);
  word = Memory::Read((this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,address,0);
  a = Memory::Read((this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,0,0);
  pVar1 = AddWords(a,~word & 0x7fff);
  Memory::Write((this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                address,word);
  Memory::Write((this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                0,pVar1.first);
  Memory::SetAccumulatorOverflow
            ((this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             pVar1.second);
  return;
}

Assistant:

void egc::Sequencer::SU (unsigned short instruction)
{
    unsigned short k = instruction & 007777u;

    std::cout << "SU" << " " << std::oct << k << std::dec << std::endl;

    auto mk = m_Memory->Read(k);
    auto a = m_Memory->Read(00000u);

    auto [result, overflow] = AddWords(a, ~mk & 077777u);

    m_Memory->Write(k, mk);
    m_Memory->Write(00000u, result);

    m_Memory->SetAccumulatorOverflow(overflow);
}